

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O1

void entry_prog_ilopheth_flute(ROOM_INDEX_DATA *room,CHAR_DATA *ch)

{
  bool bVar1;
  ROOM_INDEX_DATA *pRVar2;
  ROOM_INDEX_DATA *pRVar3;
  char *pcVar4;
  char *pcVar5;
  CHAR_DATA *arg2;
  CHAR_DATA *ch_00;
  int type;
  char buf [4608];
  char acStack_1228 [4608];
  
  pRVar2 = get_room_index(0);
  pRVar3 = get_room_index(0);
  for (ch_00 = pRVar2->people; ch_00 != (CHAR_DATA *)0x0; ch_00 = ch_00->next_in_room) {
    bVar1 = is_npc(ch_00);
    if ((bVar1) && (ch_00->pIndexData->vnum == 0x2332)) goto LAB_003040e8;
  }
  ch_00 = (CHAR_DATA *)0x0;
LAB_003040e8:
  if (ch_00 != (CHAR_DATA *)0x0) {
    if (pRVar2 == room) {
      pcVar4 = get_char_color(ch,"magenta");
      pcVar5 = END_COLOR(ch);
      sprintf(acStack_1228,
              "%sThe weathered old man ceases his flute-playing and regards you intently.%s",pcVar4,
              pcVar5);
      type = 2;
      arg2 = ch;
    }
    else {
      if (pRVar3 != room) {
        return;
      }
      pcVar4 = get_char_color(ch,"magenta");
      END_COLOR(ch);
      sprintf(acStack_1228,
              "%sA haunting melody echoes from the north, its rich tones exuding melancholy and grief.%s"
              ,pcVar4);
      type = 3;
      arg2 = (CHAR_DATA *)0x0;
      ch_00 = ch;
    }
    act(acStack_1228,ch_00,(void *)0x0,arg2,type);
  }
  return;
}

Assistant:

void entry_prog_ilopheth_flute(ROOM_INDEX_DATA *room, CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *cliff, *adj;
	CHAR_DATA *man = nullptr, *vch;
	char buf[MSL];

	cliff = get_room_index(9121);
	adj = get_room_index(9120);

	for (vch = cliff->people; vch; vch = vch->next_in_room)
	{
		if (!is_npc(vch))
			continue;
		if (vch->pIndexData->vnum == 9010)
		{
			man = vch;
			break;
		}
	}

	if (!man)
		return;

	if (room == cliff)
	{
		sprintf(buf, "%sThe weathered old man ceases his flute-playing and regards you intently.%s",
			get_char_color(ch, "magenta"),
			END_COLOR(ch));
		act(buf, man, 0, ch, TO_VICT);
	}
	else if (room == adj)
	{
		sprintf(buf, "%sA haunting melody echoes from the north, its rich tones exuding melancholy and grief.%s",
			get_char_color(ch, "magenta"),
			END_COLOR(ch));
		act(buf, ch, 0, 0, TO_CHAR);
	}
}